

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  prefix_nal_svc_t *ppVar1;
  uint32_t v;
  
  bs_write_u1(b,(uint)nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag);
  if (nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag == true) {
    v = nal->prefix_nal_svc->memory_management_base_control_operation;
    do {
      bs_write_ue(b,v);
      ppVar1 = nal->prefix_nal_svc;
      v = ppVar1->memory_management_base_control_operation;
      if (v == 1) {
        bs_write_ue(b,ppVar1->difference_of_base_pic_nums_minus1);
        ppVar1 = nal->prefix_nal_svc;
        v = ppVar1->memory_management_base_control_operation;
      }
      if (v == 2) {
        bs_write_ue(b,ppVar1->long_term_base_pic_num);
        v = nal->prefix_nal_svc->memory_management_base_control_operation;
      }
    } while (v != 0);
  }
  return;
}

Assistant:

void write_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    bs_write_u1(b, nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            bs_write_ue(b, nal->prefix_nal_svc->memory_management_base_control_operation);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->long_term_base_pic_num);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}